

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::SIMDFastPFor<4U>::getBestBFromData
          (SIMDFastPFor<4U> *this,uint32_t *in,uint8_t *bestb,uint8_t *bestcexcept,uint8_t *maxb)

{
  byte bVar1;
  byte bVar2;
  uint32_t k;
  ulong in_RAX;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int local_88 [32];
  ulong local_8;
  
  lVar3 = 0;
  local_8 = in_RAX & 0xffffffff00000000;
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0x14] = 0;
  local_88[0x15] = 0;
  local_88[0x16] = 0;
  local_88[0x17] = 0;
  local_88[0x18] = 0;
  local_88[0x19] = 0;
  local_88[0x1a] = 0;
  local_88[0x1b] = 0;
  local_88[0x1c] = 0;
  local_88[0x1d] = 0;
  local_88[0x1e] = 0;
  local_88[0x1f] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  do {
    uVar5 = in[lVar3];
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      iVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar5 = iVar6 + 1;
    }
    local_88[uVar5] = local_88[uVar5] + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  bVar2 = 0x21;
  do {
    bVar2 = bVar2 - 1;
  } while (local_88[bVar2] == 0);
  *bestb = bVar2;
  *maxb = bVar2;
  bVar2 = *bestb;
  *bestcexcept = '\0';
  bVar1 = *bestb;
  if (bVar1 - 1 < 0x20) {
    uVar4 = (uint)bVar2 << 7;
    iVar8 = 0;
    iVar6 = (uint)bVar1 * 0x80 + -0x78;
    iVar7 = 9 - (uint)bVar1;
    uVar5 = (uint)bVar1;
    do {
      iVar8 = iVar8 + local_88[uVar5];
      uVar9 = ((uint)*maxb + iVar7) * iVar8 + iVar6;
      if (uVar9 < uVar4) {
        *bestb = (char)uVar5 + 0xff;
        *bestcexcept = (uint8_t)iVar8;
        uVar4 = uVar9;
      }
      iVar6 = iVar6 + -0x80;
      iVar7 = iVar7 + 1;
      uVar9 = uVar5 - 2;
      uVar5 = uVar5 - 1;
    } while (uVar9 < 0x20);
  }
  return;
}

Assistant:

void getBestBFromData(const uint32_t *in, uint8_t &bestb,
                        uint8_t &bestcexcept, uint8_t &maxb) {
    uint32_t freqs[33];
    for (uint32_t k = 0; k <= 32; ++k)
      freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = 32;
    while (freqs[bestb] == 0)
      bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < 32; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8; // the  extra 8 is the cost of storing maxbits
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }